

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

void __thiscall
phyr::SurfaceInteraction::setShadingGeomerty
          (SurfaceInteraction *this,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,Normal3f *dndvs,
          bool overridesOrientation)

{
  Shape *pSVar1;
  Normal3f *pNVar2;
  anon_struct_128_6_d0712383_for_shadingGeom *paVar3;
  double *pdVar4;
  ulong uVar5;
  undefined4 uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar10 = dpdvs->z * dpdus->y - dpdus->z * dpdvs->y;
  dVar11 = dpdvs->x * dpdus->z - dpdus->x * dpdvs->z;
  dVar9 = dpdus->x * dpdvs->y - dpdvs->x * dpdus->y;
  dVar8 = dVar9 * dVar9 + dVar10 * dVar10 + dVar11 * dVar11;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = 1.0 / dVar8;
  paVar3 = &this->shadingGeom;
  (this->shadingGeom).n.x = dVar10 * dVar8;
  (this->shadingGeom).n.y = dVar11 * dVar8;
  pdVar4 = &(this->shadingGeom).n.z;
  (this->shadingGeom).n.z = dVar9 * dVar8;
  pSVar1 = this->shape;
  if ((pSVar1 != (Shape *)0x0) && (pSVar1->reverseNormals != pSVar1->transformChangesCoordSys)) {
    (paVar3->n).x = -(dVar10 * dVar8);
    (this->shadingGeom).n.y = -(dVar11 * dVar8);
    *pdVar4 = -(dVar9 * dVar8);
  }
  if (overridesOrientation) {
    paVar3 = (anon_struct_128_6_d0712383_for_shadingGeom *)&(this->super_Interaction).n;
    dVar8 = (this->super_Interaction).n.x;
    dVar9 = (this->super_Interaction).n.y;
    uVar6 = SUB84(dVar9,0);
    uVar7 = (uint)((ulong)dVar9 >> 0x20);
    pNVar2 = &(this->super_Interaction).n;
    dVar11 = (this->shadingGeom).n.x * dVar8 + (this->shadingGeom).n.y * dVar9;
    pdVar4 = &(this->super_Interaction).n.z;
    dVar9 = (this->super_Interaction).n.z;
    dVar10 = (this->shadingGeom).n.z;
  }
  else {
    pNVar2 = &(this->shadingGeom).n;
    dVar8 = (this->shadingGeom).n.x;
    dVar9 = (this->shadingGeom).n.y;
    uVar6 = SUB84(dVar9,0);
    uVar7 = (uint)((ulong)dVar9 >> 0x20);
    dVar11 = (this->super_Interaction).n.x * dVar8 + (this->super_Interaction).n.y * dVar9;
    dVar9 = (this->shadingGeom).n.z;
    dVar10 = (this->super_Interaction).n.z;
  }
  dVar11 = dVar10 * dVar9 + dVar11;
  if (dVar11 < 0.0) {
    uVar7 = uVar7 ^ 0x80000000;
    dVar9 = -dVar9;
  }
  uVar5 = -(ulong)(dVar11 < 0.0);
  (paVar3->n).x = (double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5);
  pNVar2->y = (double)CONCAT44(uVar7,uVar6);
  *pdVar4 = dVar9;
  (this->shadingGeom).dpdu.z = dpdus->z;
  dVar8 = dpdus->y;
  (this->shadingGeom).dpdu.x = dpdus->x;
  (this->shadingGeom).dpdu.y = dVar8;
  (this->shadingGeom).dpdv.z = dpdvs->z;
  dVar8 = dpdvs->y;
  (this->shadingGeom).dpdv.x = dpdvs->x;
  (this->shadingGeom).dpdv.y = dVar8;
  (this->shadingGeom).dndu.z = dndus->z;
  dVar8 = dndus->y;
  (this->shadingGeom).dndu.x = dndus->x;
  (this->shadingGeom).dndu.y = dVar8;
  dVar8 = dndvs->y;
  (this->shadingGeom).dndv.x = dndvs->x;
  (this->shadingGeom).dndv.y = dVar8;
  (this->shadingGeom).dndv.z = dndvs->z;
  (this->shadingGeom).overridesOrientation = overridesOrientation;
  return;
}

Assistant:

void SurfaceInteraction::setShadingGeomerty(const Vector3f& dpdus, const Vector3f& dpdvs,
                        const Normal3f& dndus, const Normal3f& dndvs,
                        bool overridesOrientation) {
    shadingGeom.n = normalize(Normal3f(cross(dpdus, dpdvs)));

    // Check if normal needs to be flipped
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys))
        shadingGeom.n = -shadingGeom.n;
    if (overridesOrientation) {
        // Shading normal has higher priority.
        // Flip true geometry normal to align with shading normal
        n = faceForward(n, shadingGeom.n);
    } else {
        // True geometry normal has higher priority.
        // Flip shading normal to align with true geometry normal
        shadingGeom.n = faceForward(shadingGeom.n, n);
    }

    shadingGeom.dpdu = dpdus; shadingGeom.dpdv = dpdvs;
    shadingGeom.dndu = dndus; shadingGeom.dndv = dndvs;
    shadingGeom.overridesOrientation = overridesOrientation;
}